

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-loader.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  yaml_node_t *pyVar3;
  char *pcVar4;
  bool bVar5;
  uint local_278;
  int error;
  int count;
  int done;
  yaml_document_t document;
  yaml_parser_t parser;
  FILE *file;
  int number;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printf("Usage: %s file1.yaml ...\n",*argv);
  }
  else {
    for (file._4_4_ = 1; (int)file._4_4_ < argc; file._4_4_ = file._4_4_ + 1) {
      bVar5 = false;
      local_278 = 0;
      bVar1 = false;
      printf("[%d] Loading \'%s\': ",(ulong)file._4_4_,argv[(int)file._4_4_]);
      fflush(_stdout);
      __stream = fopen(argv[(int)file._4_4_],"rb");
      if (__stream == (FILE *)0x0) {
        __assert_fail("file",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-loader.c"
                      ,0x22,"int main(int, char **)");
      }
      iVar2 = yaml_parser_initialize((yaml_parser_t *)&document.end_mark.column);
      if (iVar2 == 0) {
        __assert_fail("yaml_parser_initialize(&parser)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-loader.c"
                      ,0x24,"int main(int, char **)");
      }
      yaml_parser_set_input_file((yaml_parser_t *)&document.end_mark.column,(FILE *)__stream);
      while (!bVar5) {
        iVar2 = yaml_parser_load((yaml_parser_t *)&document.end_mark.column,
                                 (yaml_document_t *)&count);
        if (iVar2 == 0) {
          bVar1 = true;
          break;
        }
        pyVar3 = yaml_document_get_root_node((yaml_document_t *)&count);
        bVar5 = pyVar3 == (yaml_node_t *)0x0;
        yaml_document_delete((yaml_document_t *)&count);
        if (!bVar5) {
          local_278 = local_278 + 1;
        }
      }
      yaml_parser_delete((yaml_parser_t *)&document.end_mark.column);
      iVar2 = fclose(__stream);
      if (iVar2 != 0) {
        __assert_fail("!fclose(file)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-loader.c"
                      ,0x38,"int main(int, char **)");
      }
      pcVar4 = "SUCCESS";
      if (bVar1) {
        pcVar4 = "FAILURE";
      }
      printf("%s (%d documents)\n",pcVar4,(ulong)local_278);
    }
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
    int number;

    if (argc < 2) {
        printf("Usage: %s file1.yaml ...\n", argv[0]);
        return 0;
    }

    for (number = 1; number < argc; number ++)
    {
        FILE *file;
        yaml_parser_t parser;
        yaml_document_t document;
        int done = 0;
        int count = 0;
        int error = 0;

        printf("[%d] Loading '%s': ", number, argv[number]);
        fflush(stdout);

        file = fopen(argv[number], "rb");
        assert(file);

        assert(yaml_parser_initialize(&parser));

        yaml_parser_set_input_file(&parser, file);

        while (!done)
        {
            if (!yaml_parser_load(&parser, &document)) {
                error = 1;
                break;
            }

            done = (!yaml_document_get_root_node(&document));

            yaml_document_delete(&document);

            if (!done) count ++;
        }

        yaml_parser_delete(&parser);

        assert(!fclose(file));

        printf("%s (%d documents)\n", (error ? "FAILURE" : "SUCCESS"), count);
    }

    return 0;
}